

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O2

void GetGrid(size_t grid_idx,void *index,void *table,char *grid)

{
  long lVar1;
  ulong uVar2;
  uint pattern_id;
  ulong uVar3;
  size_t guesses;
  char pattern [82];
  
  lVar1 = (grid_idx >> 0x14) * 6;
  pattern_id = *(uint *)((long)index + lVar1);
  uVar3 = (ulong)((uint)grid_idx & 0xfffff) + (ulong)*(ushort *)((long)index + lVar1 + 4);
  while (uVar2 = (ulong)*(ushort *)((long)table + (ulong)pattern_id * 2), uVar2 <= uVar3) {
    pattern_id = pattern_id + 1;
    uVar3 = uVar3 - uVar2;
  }
  GetPattern(pattern_id,pattern);
  TdokuSolverDpllTriadSimd(pattern,uVar3 + 1,1,grid,&guesses);
  return;
}

Assistant:

void GetGrid(size_t grid_idx, const void *index, const void *table, char *grid) {
    size_t indexed_grid_idx = grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    char pattern[82];
    GetPattern(current_pattern_idx, pattern);
    size_t guesses;
    SolveSudoku(pattern, to_skip + 1, 1, grid, &guesses);
}